

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1e2216::SQLiteBuildDB::lookupRuleResult
          (SQLiteBuildDB *this,KeyID keyID,KeyType *key,Result *result_out,string *error_out)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  void *pvVar6;
  Epoch EVar7;
  value_type *pvVar8;
  value_type *pvVar9;
  pointer pcVar10;
  uint64_t uVar11;
  KeyID KVar12;
  int __oflag;
  sqlite3_stmt **ppsVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ulong uVar14;
  bool bVar15;
  Timestamp TVar16;
  iterator iVar17;
  BinaryDecoder decoder;
  DBKeyID dbKeyID;
  string local_c0;
  sqlite3_stmt **local_a0;
  DBKeyID local_98;
  ulong local_90;
  KeyID local_88;
  DependencyKeyIDs *local_80;
  Child local_78 [2];
  undefined2 local_68;
  Twine local_60;
  Twine local_48;
  
  local_88._value = keyID._value;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c3,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (result_out->builtAt != 0) {
    __assert_fail("result_out->builtAt == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c5,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  iVar2 = open(this,(char *)error_out,__oflag);
  if ((char)iVar2 != '\0') {
    local_98.value = 0;
    iVar17 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                     *)&this->dbKeyIDs,&local_88);
    if (iVar17.Ptr == (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets) {
      iVar2 = sqlite3_reset(this->findRuleResultStmt);
      if (iVar2 == 0) {
        ppsVar13 = &this->findRuleResultStmt;
        iVar2 = sqlite3_clear_bindings(*ppsVar13);
        if ((iVar2 != 0) ||
           (iVar2 = sqlite3_bind_text(*ppsVar13,1,(key->key)._M_dataplus._M_p,
                                      (int)(key->key)._M_string_length,0), iVar2 != 0))
        goto LAB_0014a3bf;
        iVar2 = sqlite3_step(*ppsVar13);
        if (iVar2 == 100) {
          local_a0 = ppsVar13;
          iVar2 = sqlite3_column_count(*ppsVar13);
          if (iVar2 != 8) {
            __assert_fail("sqlite3_column_count(findRuleResultStmt) == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x211,
                          "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                         );
          }
          local_98.value = sqlite3_column_int64(this->findRuleResultStmt,0);
          iVar2 = sqlite3_column_bytes(this->findRuleResultStmt,1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&result_out->value,(long)iVar2);
          puVar1 = (result_out->value).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar6 = (void *)sqlite3_column_blob(this->findRuleResultStmt,1);
          memcpy(puVar1,pvVar6,(long)iVar2);
          EVar7 = sqlite3_column_int64(this->findRuleResultStmt,2);
          result_out->builtAt = EVar7;
          EVar7 = sqlite3_column_int64(this->findRuleResultStmt,3);
          result_out->computedAt = EVar7;
          TVar16 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,4);
          result_out->start = TVar16;
          TVar16 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,5);
          result_out->end = TVar16;
          pvVar8 = llvm::
                   DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                   ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                       *)&this->engineKeyIDs,&local_98);
          (pvVar8->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = local_88._value;
          pvVar9 = llvm::
                   DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                   ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                       *)&this->dbKeyIDs,&local_88);
          (pvVar9->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_98.value;
          ppsVar13 = local_a0;
          goto LAB_0014a64a;
        }
        if (iVar2 != 0x65) goto LAB_0014a34e;
      }
      else {
LAB_0014a3bf:
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
        std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      bVar15 = false;
      goto LAB_0014a45e;
    }
    iVar2 = sqlite3_reset(this->fastFindRuleResultStmt);
    if (iVar2 == 0) {
      ppsVar13 = &this->fastFindRuleResultStmt;
      iVar2 = sqlite3_clear_bindings(*ppsVar13);
      if ((iVar2 == 0) &&
         (iVar2 = sqlite3_bind_int64(*ppsVar13,1,
                                     ((iVar17.Ptr)->super_pair<llbuild::core::KeyID,_DBKeyID>).
                                     second.value), iVar2 == 0)) {
        iVar2 = sqlite3_step(*ppsVar13);
        if (iVar2 != 100) {
          if (iVar2 == 0x65) goto LAB_0014a45c;
          goto LAB_0014a427;
        }
        iVar2 = sqlite3_column_count(*ppsVar13);
        if (iVar2 != 8) {
          __assert_fail("sqlite3_column_count(fastFindRuleResultStmt) == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x1e8,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                       );
        }
        local_98.value = sqlite3_column_int64(*ppsVar13,0);
        iVar2 = sqlite3_column_bytes(*ppsVar13,1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&result_out->value,(long)iVar2);
        puVar1 = (result_out->value).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar6 = (void *)sqlite3_column_blob(*ppsVar13,1);
        memcpy(puVar1,pvVar6,(long)iVar2);
        EVar7 = sqlite3_column_int64(*ppsVar13,2);
        result_out->builtAt = EVar7;
        EVar7 = sqlite3_column_int64(*ppsVar13,3);
        result_out->computedAt = EVar7;
        TVar16 = (Timestamp)sqlite3_column_double(*ppsVar13,4);
        result_out->start = TVar16;
        TVar16 = (Timestamp)sqlite3_column_double(*ppsVar13,5);
        result_out->end = TVar16;
LAB_0014a64a:
        uVar3 = sqlite3_column_bytes(*ppsVar13,6);
        pcVar10 = (pointer)sqlite3_column_blob(*ppsVar13,6);
        uVar11 = sqlite3_column_int64(*ppsVar13,7);
        (result_out->signature).value = uVar11;
        if ((uVar3 & 7) == 0) {
          iVar2 = (int)uVar3 >> 3;
          local_90 = CONCAT44(local_90._4_4_,iVar2);
          local_a0 = (sqlite3_stmt **)(long)(int)uVar3;
          local_80 = &result_out->dependencies;
          std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::resize
                    (&local_80->keys,(long)iVar2);
          this_00 = &(result_out->dependencies).flags;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(long)iVar2);
          local_c0._M_string_length = (size_type)local_a0;
          local_c0.field_2._M_allocated_capacity = 0;
          bVar15 = uVar3 < 8;
          local_c0._M_dataplus._M_p = pcVar10;
          if (!bVar15) {
            uVar4 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
            local_a0 = (sqlite3_stmt **)CONCAT44(local_a0._4_4_,uVar4);
            uVar5 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
            KVar12 = getKeyIDForID(this,(DBKeyID)(CONCAT44(uVar5,uVar4) >> 2),error_out);
            if (error_out->_M_string_length == 0) {
              local_90 = (local_90 & 0xffffffff) - 1;
              uVar14 = 0;
              do {
                (local_80->keys).
                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar14]._value = KVar12._value;
                (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start[uVar14] = (byte)local_a0 & 3;
                bVar15 = local_90 == uVar14;
                if (bVar15) break;
                uVar4 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
                local_a0 = (sqlite3_stmt **)CONCAT44(local_a0._4_4_,uVar4);
                uVar5 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
                KVar12 = getKeyIDForID(this,(DBKeyID)(CONCAT44(uVar5,uVar4) >> 2),error_out);
                uVar14 = uVar14 + 1;
              } while (error_out->_M_string_length == 0);
            }
          }
          goto LAB_0014a45e;
        }
        llvm::Twine::Twine(&local_60,"unexpected contents for database result: ");
        local_68 = 0x10a;
        local_78[0].decUI = (uint)local_98.value;
        llvm::operator+(&local_48,&local_60,(Twine *)local_78);
        llvm::Twine::str_abi_cxx11_(&local_c0,&local_48);
      }
      else {
LAB_0014a427:
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
      }
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0014a45c;
    }
    else {
LAB_0014a34e:
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0014a45c;
    }
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
LAB_0014a45c:
  bVar15 = false;
LAB_0014a45e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar15;
}

Assistant:

virtual bool lookupRuleResult(KeyID keyID, const KeyType& key,
                                Result* result_out,
                                std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    assert(result_out->builtAt == 0);

    if (!open(error_out)) {
      return false;
    }

    // Fetch the basic rule information.
    int result;
    int numDependencyBytes = 0;
    const void* dependencyBytes = nullptr;
    DBKeyID dbKeyID;

    // Check if we already have the key mapping
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      // DBKeyID is known, perform the fast path that avoids table joining

      result = sqlite3_reset(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_int64(fastFindRuleResultStmt, /*index=*/1,
                                  it->second.value);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(fastFindRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(fastFindRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(fastFindRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(fastFindRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(fastFindRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(fastFindRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(fastFindRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(fastFindRuleResultStmt, 5);

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(fastFindRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(fastFindRuleResultStmt, 7));
    } else {
      // KeyID is not known, perform the 'normal' search using the key value

      result = sqlite3_reset(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_text(findRuleResultStmt, /*index=*/1,
                                 key.data(), key.size(),
                                 SQLITE_STATIC);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(findRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(findRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(findRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(findRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(findRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(findRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(findRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(findRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(findRuleResultStmt, 5);

      // Cache the engine key mapping
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(findRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(findRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(findRuleResultStmt, 7));
    }


    int numDependencies = numDependencyBytes / sizeof(uint64_t);
    if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
      *error_out = (llvm::Twine("unexpected contents for database result: ") +
                    llvm::Twine((int)dbKeyID.value)).str();
      return false;
    }
    result_out->dependencies.resize(numDependencies);
    basic::BinaryDecoder decoder(
        StringRef((const char*)dependencyBytes, numDependencyBytes));
    for (auto i = 0; i != numDependencies; ++i) {
      uint64_t raw;
      decoder.read(raw);
      bool orderOnly = raw & 1;
      bool singleUse = (raw >> 1) & 1;
      DBKeyID dbKeyID(raw >> 2);

      // Map the database key ID into an engine key ID (note that we already
      // hold the dbMutex at this point as required by getKeyIDforID())
      KeyID keyID = getKeyIDForID(dbKeyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      result_out->dependencies.set(i, keyID, orderOnly, singleUse);
    }

    return true;
  }